

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O2

void __thiscall
opengv::absolute_pose::modules::Epnp::estimate_R_and_t(Epnp *this,double (*R) [3],double *t)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint uVar10;
  int j_1;
  double *pdVar11;
  double *pdVar12;
  int i;
  ulong uVar13;
  int j;
  long lVar14;
  double *pdVar15;
  long lVar16;
  int j_2;
  long lVar17;
  double *pdVar18;
  double (*padVar19) [3];
  double *pdVar20;
  Scalar SVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  double local_3b8 [4];
  double local_398 [4];
  double local_378;
  double local_370;
  double local_368;
  MatrixXd Abt_v;
  MatrixXd Abt_u;
  MatrixXd Abt_v_prime;
  CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
  local_310;
  Index local_2c8;
  MatrixXd *local_2c0;
  long local_2b8;
  undefined8 local_2b0;
  undefined8 local_2a8;
  MatrixXd Abt;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> local_288;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVD;
  
  local_3b8[2] = 0.0;
  local_398[2] = 0.0;
  local_3b8[0] = 0.0;
  local_3b8[1] = 0.0;
  local_398[0] = 0.0;
  local_398[1] = 0.0;
  uVar10 = this->number_of_correspondences;
  pdVar11 = this->pws;
  pdVar12 = this->pcs;
  for (uVar13 = 0; uVar13 != (~((int)uVar10 >> 0x1f) & uVar10); uVar13 = uVar13 + 1) {
    for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
      local_3b8[lVar14] = pdVar12[lVar14] + local_3b8[lVar14];
      local_398[lVar14] = pdVar11[lVar14] + local_398[lVar14];
    }
    pdVar11 = pdVar11 + 3;
    pdVar12 = pdVar12 + 3;
  }
  for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
    local_3b8[lVar14] = local_3b8[lVar14] / (double)(int)uVar10;
    local_398[lVar14] = local_398[lVar14] / (double)(int)uVar10;
  }
  SVD.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.m_matrixU.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data._0_4_ = 3;
  local_310.m_xpr.
  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data =
       (PointerType)
       CONCAT44(local_310.m_xpr.
                super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                .
                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                .m_data._4_4_,3);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&Abt,(int *)&SVD,(int *)&local_310);
  pdVar11 = Abt.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
  for (lVar14 = 0; pdVar12 = pdVar11, lVar16 = 3, lVar14 != 3; lVar14 = lVar14 + 1) {
    while (lVar16 != 0) {
      *pdVar12 = 0.0;
      pdVar12 = pdVar12 + Abt.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                          m_storage.m_rows;
      lVar16 = lVar16 + -1;
    }
    pdVar11 = pdVar11 + 1;
  }
  uVar10 = this->number_of_correspondences;
  pdVar11 = this->pws;
  pdVar12 = this->pcs;
  local_368 = local_398[0];
  local_378 = local_398[1];
  local_370 = local_398[2];
  for (uVar13 = 0; pdVar15 = local_3b8, lVar14 = 3,
      pdVar18 = Abt.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                m_data, pdVar20 = pdVar12, uVar13 != (~((int)uVar10 >> 0x1f) & uVar10);
      uVar13 = uVar13 + 1) {
    while (lVar14 != 0) {
      dVar26 = *pdVar15;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = *pdVar18;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = *pdVar20 - dVar26;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = pdVar11[uVar13 * 3] - local_398[0];
      auVar33 = vfmadd213sd_fma(auVar22,auVar30,auVar3);
      *pdVar18 = auVar33._0_8_;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = pdVar18[Abt.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_rows];
      auVar23._8_8_ = 0;
      auVar23._0_8_ = *pdVar20 - dVar26;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = pdVar11[uVar13 * 3 + 1] - local_398[1];
      auVar33 = vfmadd213sd_fma(auVar23,auVar31,auVar4);
      pdVar18[Abt.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows]
           = auVar33._0_8_;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = pdVar18[Abt.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_rows * 2];
      auVar24._8_8_ = 0;
      auVar24._0_8_ = *pdVar20 - dVar26;
      auVar32._8_8_ = 0;
      auVar32._0_8_ = pdVar11[uVar13 * 3 + 2] - local_398[2];
      auVar33 = vfmadd213sd_fma(auVar24,auVar32,auVar5);
      pdVar18[Abt.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
              * 2] = auVar33._0_8_;
      pdVar15 = pdVar15 + 1;
      lVar14 = lVar14 + -1;
      pdVar18 = pdVar18 + 1;
      pdVar20 = pdVar20 + 1;
    }
    pdVar12 = pdVar12 + 3;
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD(&SVD,&Abt,0x14);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)&Abt_u,
             (DenseStorage<double,__1,__1,__1,_0> *)&SVD);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)&Abt_v,
             (DenseStorage<double,__1,__1,__1,_0> *)
             &SVD.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
              m_matrixV);
  padVar19 = R;
  for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
    lVar16 = 0;
    for (lVar17 = 0; lVar17 != 3; lVar17 = lVar17 + 1) {
      local_310.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_xpr =
           &Abt_u;
      local_310.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data =
           Abt_u.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data +
           lVar14;
      local_310._56_8_ =
           (long)Abt_v.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                 m_data + lVar16;
      local_310.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>._16_8_ =
           Abt_u.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
      local_2c0 = &Abt_v;
      local_310.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_startCol.
      m_value = 0;
      local_310.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      m_outerStride = 1;
      local_2c8 = Abt_v.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                  m_cols;
      local_2b0 = 0;
      local_2a8 = 1;
      local_310.m_xpr.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_startRow.
      m_value = lVar14;
      local_2b8 = lVar17;
      SVar21 = Eigen::internal::dense_product_base::operator_cast_to_double
                         ((dense_product_base *)&local_310);
      (*padVar19)[lVar17] = SVar21;
      lVar16 = lVar16 + 8;
    }
    padVar19 = padVar19 + 1;
  }
  dVar26 = (*R)[1];
  dVar1 = (*R)[0];
  auVar42._8_8_ = 0;
  auVar42._0_8_ = R[2][0];
  auVar37._8_8_ = 0;
  auVar37._0_8_ = R[2][2];
  auVar44._8_8_ = 0;
  auVar44._0_8_ = R[2][1];
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar1 * R[1][1];
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar26 * R[1][2] * R[2][0];
  auVar33 = vfmadd231sd_fma(auVar40,auVar37,auVar33);
  dVar2 = (*R)[2];
  auVar43._8_8_ = 0;
  auVar43._0_8_ = R[1][0] * dVar2;
  auVar33 = vfmadd213sd_fma(auVar43,auVar44,auVar33);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = R[1][1] * dVar2;
  auVar33 = vfnmadd213sd_fma(auVar35,auVar42,auVar33);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = R[1][0] * dVar26;
  auVar33 = vfnmadd213sd_fma(auVar41,auVar37,auVar33);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = R[1][2] * dVar1;
  auVar33 = vfnmadd213sd_fma(auVar36,auVar44,auVar33);
  if (auVar33._0_8_ < 0.0) {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
              ((DenseStorage<double,__1,__1,__1,_0> *)&Abt_v_prime,
               (DenseStorage<double,__1,__1,__1,_0> *)&Abt_v);
    local_310.m_xpr.
    super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data =
         Abt_v.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data +
         Abt_v.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows * 2
    ;
    local_310.m_xpr.
    super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_rows.
    m_value = Abt_v.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_rows;
    local_310.m_xpr.
    super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_startRow.
    m_value = 0;
    local_310.m_xpr.
    super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_startCol.
    m_value = 2;
    local_310.m_xpr.
    super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_outerStride
         = Abt_v.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
    local_288.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data =
         Abt_v_prime.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_data + Abt_v_prime.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows * 2;
    local_288.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_rows.
    m_value = Abt_v_prime.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
              .m_rows;
    local_288.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_startRow.
    m_value = 0;
    local_288.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_startCol.
    m_value = 2;
    local_288.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_outerStride
         = Abt_v_prime.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows;
    local_310.m_xpr.
    super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_xpr =
         (XprTypeNested)&Abt_v;
    local_288.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_xpr =
         (XprTypeNested)&Abt_v_prime;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const>>
              (&local_288,&local_310);
    padVar19 = R;
    for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
      lVar16 = 0;
      for (lVar17 = 0; lVar17 != 3; lVar17 = lVar17 + 1) {
        local_310.m_xpr.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.m_xpr =
             &Abt_u;
        local_310.m_xpr.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data
             = Abt_u.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_data + lVar14;
        local_310._56_8_ =
             (long)Abt_v_prime.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_data + lVar16;
        local_310.m_xpr.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>._16_8_
             = Abt_u.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_cols;
        local_2c0 = &Abt_v_prime;
        local_310.m_xpr.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        m_startCol.m_value = 0;
        local_310.m_xpr.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        m_outerStride = 1;
        local_2c8 = Abt_v_prime.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_cols;
        local_2b0 = 0;
        local_2a8 = 1;
        local_310.m_xpr.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        m_startRow.m_value = lVar14;
        local_2b8 = lVar17;
        SVar21 = Eigen::internal::dense_product_base::operator_cast_to_double
                           ((dense_product_base *)&local_310);
        (*padVar19)[lVar17] = SVar21;
        lVar16 = lVar16 + 8;
      }
      padVar19 = padVar19 + 1;
    }
    Eigen::internal::handmade_aligned_free
              (Abt_v_prime.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_data);
    dVar1 = (*R)[0];
    dVar26 = (*R)[1];
    dVar2 = (*R)[2];
  }
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar2;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar1;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = local_368;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = local_370;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar26 * local_378;
  auVar33 = vfmadd231sd_fma(auVar27,auVar38,auVar25);
  auVar33 = vfmadd231sd_fma(auVar33,auVar39,auVar34);
  *t = local_3b8[0] - auVar33._0_8_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = R[1][0];
  auVar28._8_8_ = 0;
  auVar28._0_8_ = local_378 * R[1][1];
  auVar33 = vfmadd231sd_fma(auVar28,auVar38,auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = R[1][2];
  auVar33 = vfmadd231sd_fma(auVar33,auVar39,auVar7);
  t[1] = local_3b8[1] - auVar33._0_8_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = R[2][0];
  auVar29._8_8_ = 0;
  auVar29._0_8_ = local_378 * R[2][1];
  auVar33 = vfmadd231sd_fma(auVar29,auVar38,auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = R[2][2];
  auVar33 = vfmadd231sd_fma(auVar33,auVar39,auVar9);
  t[2] = local_3b8[2] - auVar33._0_8_;
  Eigen::internal::handmade_aligned_free
            (Abt_v.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
            );
  Eigen::internal::handmade_aligned_free
            (Abt_u.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
            );
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD(&SVD);
  Eigen::internal::handmade_aligned_free
            (Abt.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  return;
}

Assistant:

void
opengv::absolute_pose::modules::Epnp::estimate_R_and_t(
    double R[3][3],
    double t[3])
{
  double pc0[3], pw0[3];

  pc0[0] = pc0[1] = pc0[2] = 0.0;
  pw0[0] = pw0[1] = pw0[2] = 0.0;

  for(int i = 0; i < number_of_correspondences; i++)
  {
    const double * pc = pcs + 3 * i;
    const double * pw = pws + 3 * i;

    for(int j = 0; j < 3; j++)
    {
      pc0[j] += pc[j];
      pw0[j] += pw[j];
    }
  }
  for(int j = 0; j < 3; j++)
  {
    pc0[j] /= number_of_correspondences;
    pw0[j] /= number_of_correspondences;
  }

  Eigen::MatrixXd Abt(3,3);

  for(int i = 0; i < 3; i++)
  {
    for(int j = 0; j < 3; j++)
      Abt(i,j) = 0.0;
  }

  for(int i = 0; i < number_of_correspondences; i++)
  {
    double * pc = pcs + 3 * i;
    double * pw = pws + 3 * i;

    for(int j = 0; j < 3; j++)
    {
      Abt(j,0) += (pc[j] - pc0[j]) * (pw[0] - pw0[0]);
      Abt(j,1) += (pc[j] - pc0[j]) * (pw[1] - pw0[1]);
      Abt(j,2) += (pc[j] - pc0[j]) * (pw[2] - pw0[2]);
    }
  }

  Eigen::JacobiSVD< Eigen::MatrixXd > SVD(
      Abt,
      Eigen::ComputeFullV | Eigen::ComputeFullU );
  Eigen::MatrixXd Abt_u = SVD.matrixU();
  Eigen::MatrixXd Abt_v = SVD.matrixV();

  for(int i = 0; i < 3; i++)
    for(int j = 0; j < 3; j++)
      R[i][j] = Abt_u.row(i) * Abt_v.row(j).transpose();

  const double det =
      R[0][0] * R[1][1] * R[2][2] +
      R[0][1] * R[1][2] * R[2][0] +
      R[0][2] * R[1][0] * R[2][1] -
      R[0][2] * R[1][1] * R[2][0] -
      R[0][1] * R[1][0] * R[2][2] -
      R[0][0] * R[1][2] * R[2][1];

  //change 1: negative determinant problem is solved by changing Abt_v, not R

  if (det < 0)
  {
    //R[2][0] = -R[2][0];
    //R[2][1] = -R[2][1];
    //R[2][2] = -R[2][2];
    Eigen::MatrixXd Abt_v_prime = Abt_v;
    Abt_v_prime.col(2) = -Abt_v.col(2);
    for(int i = 0; i < 3; i++)
      for(int j = 0; j < 3; j++)
        R[i][j] = Abt_u.row(i) * Abt_v_prime.row(j).transpose();
  }

  t[0] = pc0[0] - dot(R[0], pw0);
  t[1] = pc0[1] - dot(R[1], pw0);
  t[2] = pc0[2] - dot(R[2], pw0);
}